

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# medfilt.cc
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t sVar6;
  ostream *this;
  char *__s;
  string *input_stream;
  bool bVar7;
  int num_input_order;
  int num_filter_order;
  double magic_number;
  ostringstream error_message_7;
  vector<double,_std::allocator<double>_> output;
  ifstream ifs;
  MedianFilter median_filter;
  InputSourceFromStream input_source;
  option long_options [2];
  int local_524;
  int local_520;
  int local_51c;
  double local_518;
  string local_510;
  undefined8 local_4f0;
  string local_4e8 [3];
  ios_base local_478 [264];
  vector<double,_std::allocator<double>_> local_370;
  string local_358;
  byte abStack_338 [80];
  ios_base local_2e8 [408];
  MedianFilter local_150;
  InputSourceFromStream local_98;
  option local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_524 = 0;
  local_520 = 2;
  local_518 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.flag = (int *)0x0;
  local_78.val = 1000;
  local_78._28_4_ = 0;
  local_78.name = "magic";
  local_78.has_arg = 1;
  local_78._12_4_ = 0;
  local_51c = 0;
  uVar1 = 0;
LAB_001037b5:
  do {
    while (local_4f0 = uVar1,
          iVar4 = ya_getopt_long_only(argc,argv,"l:m:k:w:h",&local_78,(int *)0x0), iVar4 < 0x77) {
      switch(iVar4) {
      case 0x68:
        anon_unknown.dwarf_310f::PrintUsage((ostream *)&std::cout);
        return 0;
      case 0x6b:
        std::__cxx11::string::string((string *)&local_358,ya_optarg,(allocator *)local_4e8);
        bVar2 = sptk::ConvertStringToInteger(&local_358,&local_520);
        bVar7 = local_520 < 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        uVar1 = local_4f0;
        if (!bVar2 || bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_358,"The argument for the -k option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_358,"non-negative integer",0x14);
          local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
          sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
          goto LAB_00103c05;
        }
        break;
      case 0x6c:
        std::__cxx11::string::string((string *)&local_358,ya_optarg,(allocator *)local_4e8);
        bVar7 = sptk::ConvertStringToInteger(&local_358,&local_524);
        bVar2 = local_524 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if (!bVar7 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_358,
                     "The argument for the -l option must be a positive integer",0x39);
          local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
          sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
          goto LAB_00103c05;
        }
        local_524 = local_524 + -1;
        uVar1 = local_4f0;
        break;
      case 0x6d:
        goto switchD_001037ed_caseD_6d;
      default:
        if (iVar4 == -1) {
          if (1 < argc - ya_optind) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_358,"Too many input files",0x14);
            local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
            sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
            goto LAB_00103c05;
          }
          if (argc == ya_optind) {
            __s = (char *)0x0;
          }
          else {
            __s = argv[ya_optind];
          }
          bVar2 = sptk::SetBinaryMode();
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_358,"Cannot set translation mode",0x1b);
            local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
            sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
            goto LAB_00103c05;
          }
          input_stream = &local_358;
          std::ifstream::ifstream(input_stream);
          if ((__s != (char *)0x0) &&
             (std::ifstream::open((char *)&local_358,(_Ios_Openmode)__s),
             (abStack_338[*(long *)(local_358._M_dataplus._M_p + -0x18)] & 5) != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4e8,"Cannot open file ",0x11);
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4e8,__s,sVar6);
            local_150.super_InputSourceInterface._vptr_InputSourceInterface =
                 (_func_int **)&local_150.input_source_;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"medfilt","");
            sptk::PrintErrorMessage((string *)&local_150,(ostringstream *)local_4e8);
            if ((InputSourceInterface **)
                local_150.super_InputSourceInterface._vptr_InputSourceInterface !=
                &local_150.input_source_) {
              operator_delete(local_150.super_InputSourceInterface._vptr_InputSourceInterface);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
            std::ios_base::~ios_base(local_478);
            iVar4 = 1;
            goto LAB_00103fc7;
          }
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            input_stream = (string *)&std::cin;
          }
          sptk::InputSourceFromStream::InputSourceFromStream
                    (&local_98,false,local_524 + 1,(istream *)input_stream);
          sptk::MedianFilter::MedianFilter
                    (&local_150,local_524,local_520,&local_98.super_InputSourceInterface,
                     local_51c == 0,(bool)((byte)local_4f0 & 1),local_518);
          if (local_150.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4e8,"Failed to initialize MedianFilter",0x21);
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"medfilt","");
            sptk::PrintErrorMessage(&local_510,(ostringstream *)local_4e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
            std::ios_base::~ios_base(local_478);
            iVar4 = 1;
            goto LAB_00103fba;
          }
          iVar4 = 1;
          if (local_150.apply_each_dimension_ != false) {
            iVar4 = local_150.num_input_order_ + 1;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_370,(long)iVar4,(allocator_type *)local_4e8);
          goto LAB_00103e72;
        }
      case 0x69:
      case 0x6a:
switchD_001037ed_caseD_69:
        anon_unknown.dwarf_310f::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
    }
    if (iVar4 == 0x77) {
      std::__cxx11::string::string((string *)&local_358,ya_optarg,(allocator *)local_4e8);
      bVar2 = sptk::ConvertStringToInteger(&local_358,(int *)&local_150);
      if (bVar2) {
        bVar2 = sptk::IsInRange((int)local_150.super_InputSourceInterface._vptr_InputSourceInterface
                                ,0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
        if (bVar2) {
          local_51c = (int)local_150.super_InputSourceInterface._vptr_InputSourceInterface;
          uVar1 = local_4f0;
          goto LAB_001037b5;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_358,"The argument for the -w option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_358,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)&local_358,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,1);
      local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
      sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
      goto LAB_00103c05;
    }
    if (iVar4 != 1000) goto switchD_001037ed_caseD_69;
    std::__cxx11::string::string((string *)&local_358,ya_optarg,(allocator *)local_4e8);
    bVar2 = sptk::ConvertStringToDouble(&local_358,&local_518);
    paVar5 = &local_358.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != paVar5) {
      operator_delete(local_358._M_dataplus._M_p);
      paVar5 = extraout_RAX;
    }
    uVar1 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_358,"The argument for the -magic option must be a number",0x33);
      local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
      sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
      goto LAB_00103c05;
    }
  } while( true );
switchD_001037ed_caseD_6d:
  std::__cxx11::string::string((string *)&local_358,ya_optarg,(allocator *)local_4e8);
  bVar2 = sptk::ConvertStringToInteger(&local_358,&local_524);
  bVar7 = local_524 < 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  uVar1 = local_4f0;
  if (!bVar2 || bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_358);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_358,"The argument for the -m option must be a ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_358,"non-negative integer",0x14);
    local_4e8[0]._M_dataplus._M_p = (pointer)&local_4e8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"medfilt","");
    sptk::PrintErrorMessage(local_4e8,(ostringstream *)&local_358);
LAB_00103c05:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8[0]._M_dataplus._M_p != &local_4e8[0].field_2) {
      operator_delete(local_4e8[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_358);
    std::ios_base::~ios_base(local_2e8);
    return 1;
  }
  goto LAB_001037b5;
  while (bVar2 = sptk::WriteStream<double>(0,iVar4,&local_370,(ostream *)&std::cout,(int *)0x0),
        bVar2) {
LAB_00103e72:
    bVar2 = sptk::MedianFilter::Get(&local_150,&local_370);
    if (!bVar2) {
      iVar4 = 0;
      goto LAB_00103fa8;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4e8,"Failed to write output",0x16);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"medfilt","");
  sptk::PrintErrorMessage(&local_510,(ostringstream *)local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
  std::ios_base::~ios_base(local_478);
  iVar4 = 1;
LAB_00103fa8:
  if (local_370.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00103fba:
  sptk::MedianFilter::~MedianFilter(&local_150);
LAB_00103fc7:
  std::ifstream::~ifstream(&local_358);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_filter_order(kDefaultNumFilterOrder);
  WaysToApplyFilter way_to_apply_filter(kDefaultWayToApplyFilter);
  double magic_number(0.0);
  bool is_magic_number_specified(false);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:k:w:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        --num_input_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -k option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        break;
      }
      case 'w': {
        const int min(0);
        const int max(static_cast<int>(kNumWaysToApplyFilter) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -w option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        way_to_apply_filter = static_cast<WaysToApplyFilter>(tmp);
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("medfilt", error_message);
          return 1;
        }
        is_magic_number_specified = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int input_length(num_input_order + 1);
  sptk::InputSourceFromStream input_source(false, input_length, &input_stream);
  sptk::MedianFilter median_filter(num_input_order, num_filter_order,
                                   &input_source,
                                   kEachDimension == way_to_apply_filter,
                                   is_magic_number_specified, magic_number);
  if (!median_filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MedianFilter";
    sptk::PrintErrorMessage("medfilt", error_message);
    return 1;
  }

  const int output_length(median_filter.GetSize());
  std::vector<double> output(output_length);

  while (median_filter.Get(&output)) {
    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output";
      sptk::PrintErrorMessage("medfilt", error_message);
      return 1;
    }
  }

  return 0;
}